

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignum.cpp
# Opt level: O2

int __thiscall
CVmObjBigNum::calc_asincos
          (CVmObjBigNum *this,vm_obj_id_t self,vm_val_t *retval,uint *argc,int is_acos)

{
  int iVar1;
  char *in_RAX;
  char *new_ext;
  
  new_ext = in_RAX;
  iVar1 = setup_getp_0(this,self,retval,argc,&new_ext);
  if (iVar1 == 0) {
    calc_asincos_into(new_ext,(this->super_CVmObject).ext_,is_acos);
    sp_ = sp_ + -1;
  }
  return 1;
}

Assistant:

int CVmObjBigNum::calc_asincos(VMG_ vm_obj_id_t self,
                               vm_val_t *retval, uint *argc, int is_acos)
{
    char *new_ext;

    /* check arguments and set up the result */
    if (setup_getp_0(vmg_ self, retval, argc, &new_ext))
        return TRUE;

    /* calculate the arcsin/arccos into the result */
    calc_asincos_into(new_ext, ext_, is_acos);

    /* remove my self-reference */
    G_stk->discard();

    /* handled */
    return TRUE;
}